

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioDriver.cpp
# Opt level: O2

void __thiscall AudioDriver::loadAudioSettings(AudioDriver *this)

{
  bool bVar1;
  uint uVar2;
  SamplerateConversionQuality SVar3;
  Master *this_00;
  QSettings *pQVar4;
  QArrayDataPointer<char16_t> local_90;
  QVariant local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  QString prefix;
  
  this_00 = Master::getInstance();
  pQVar4 = Master::getSettings(this_00);
  operator+(&prefix,"Audio/",&this->id);
  operator+((QString *)&local_90,&prefix,"/SampleRate");
  QVariant::QVariant((QVariant *)&local_58,0);
  QSettings::value((QString *)&local_78,(QVariant *)pQVar4);
  uVar2 = QVariant::toUInt((bool *)&local_78);
  (this->settings).sampleRate = uVar2;
  QVariant::~QVariant(&local_78);
  QVariant::~QVariant((QVariant *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  operator+((QString *)&local_90,&prefix,"/SRCQuality");
  QVariant::QVariant((QVariant *)&local_58,2);
  QSettings::value((QString *)&local_78,(QVariant *)pQVar4);
  SVar3 = QVariant::toUInt((bool *)&local_78);
  (this->settings).srcQuality = SVar3;
  QVariant::~QVariant(&local_78);
  QVariant::~QVariant((QVariant *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  operator+((QString *)&local_90,&prefix,"/ChunkLen");
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  local_40 = 2;
  QSettings::value((QString *)&local_78,(QVariant *)pQVar4);
  uVar2 = QVariant::toInt((bool *)&local_78);
  (this->settings).chunkLen = uVar2;
  QVariant::~QVariant(&local_78);
  QVariant::~QVariant((QVariant *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  operator+((QString *)&local_90,&prefix,"/AudioLatency");
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  local_40 = 2;
  QSettings::value((QString *)&local_78,(QVariant *)pQVar4);
  uVar2 = QVariant::toInt((bool *)&local_78);
  (this->settings).audioLatency = uVar2;
  QVariant::~QVariant(&local_78);
  QVariant::~QVariant((QVariant *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  operator+((QString *)&local_90,&prefix,"/MidiLatency");
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  local_40 = 2;
  QSettings::value((QString *)&local_78,(QVariant *)pQVar4);
  uVar2 = QVariant::toInt((bool *)&local_78);
  (this->settings).midiLatency = uVar2;
  QVariant::~QVariant(&local_78);
  QVariant::~QVariant((QVariant *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  operator+((QString *)&local_90,&prefix,"/AdvancedTiming");
  QVariant::QVariant((QVariant *)&local_58,true);
  QSettings::value((QString *)&local_78,(QVariant *)pQVar4);
  bVar1 = (bool)QVariant::toBool();
  (this->settings).advancedTiming = bVar1;
  QVariant::~QVariant(&local_78);
  QVariant::~QVariant((QVariant *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  (*this->_vptr_AudioDriver[1])(this,&this->settings);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&prefix.d);
  return;
}

Assistant:

void AudioDriver::loadAudioSettings() {
	QSettings *qSettings = Master::getInstance()->getSettings();
	QString prefix = "Audio/" + id;
	settings.sampleRate = qSettings->value(prefix + "/SampleRate", 0).toUInt();
	settings.srcQuality = MT32Emu::SamplerateConversionQuality(qSettings->value(prefix + "/SRCQuality", MT32Emu::SamplerateConversionQuality_GOOD).toUInt());
	settings.chunkLen = qSettings->value(prefix + "/ChunkLen").toInt();
	settings.audioLatency = qSettings->value(prefix + "/AudioLatency").toInt();
	settings.midiLatency = qSettings->value(prefix + "/MidiLatency").toInt();
	settings.advancedTiming = qSettings->value(prefix + "/AdvancedTiming", true).toBool();
	validateAudioSettings(settings);
}